

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O2

uint32_t rgbcx::bc1_find_sels4
                   (uint32_t flags,color32 *pSrc_pixels,uint32_t lr,uint32_t lg,uint32_t lb,
                   uint32_t hr,uint32_t hg,uint32_t hb,uint8_t *sels,uint32_t cur_err)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint32_t i_2;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint32_t i;
  long lVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  uint uVar22;
  uint uVar23;
  int iVar24;
  undefined4 uVar25;
  uint8_t uVar26;
  uint32_t j;
  uint uVar27;
  int iVar28;
  int iVar29;
  ulong uVar30;
  uint32_t block_b [4];
  uint32_t block_g [4];
  uint32_t block_r [4];
  int local_48 [6];
  ulong uVar21;
  
  if ((char)flags < '\0') {
    bc1_get_block_colors4(block_r,block_g,block_b,lr,lg,lb,hr,hg,hb);
    for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
      local_48[lVar16] =
           block_b[lVar16] * (block_b[3] - block_b[0]) +
           block_g[lVar16] * (block_g[3] - block_g[0]) + block_r[lVar16] * (block_r[3] - block_r[0])
      ;
    }
    local_48[0] = local_48[0] + local_48[1];
    local_48[1] = local_48[1] + local_48[2];
    local_48[2] = local_48[2] + local_48[3];
    iVar7 = (block_r[3] - block_r[0]) * 2;
    iVar8 = (block_g[3] - block_g[0]) * 2;
    iVar10 = (block_b[3] - block_b[0]) * 2;
    uVar30 = 0;
    uVar5 = 0;
    do {
      if (0xf < uVar30) {
        return uVar5;
      }
      iVar28 = (uint)pSrc_pixels[uVar30].field_0.field_0.b * iVar10 +
               (uint)pSrc_pixels[uVar30].field_0.field_0.g * iVar8 +
               (uint)pSrc_pixels[uVar30].field_0.field_0.r * iVar7;
      iVar18 = (uint)pSrc_pixels[uVar30 + 1].field_0.field_0.b * iVar10 +
               (uint)pSrc_pixels[uVar30 + 1].field_0.field_0.g * iVar8 +
               (uint)pSrc_pixels[uVar30 + 1].field_0.field_0.r * iVar7;
      iVar24 = (uint)pSrc_pixels[uVar30 + 2].field_0.field_0.b * iVar10 +
               (uint)pSrc_pixels[uVar30 + 2].field_0.field_0.g * iVar8 +
               (uint)pSrc_pixels[uVar30 + 2].field_0.field_0.r * iVar7;
      iVar6 = (uint)pSrc_pixels[uVar30 + 3].field_0.field_0.b * iVar10 +
              (uint)pSrc_pixels[uVar30 + 3].field_0.field_0.g * iVar8 +
              (uint)pSrc_pixels[uVar30 + 3].field_0.field_0.r * iVar7;
      bVar1 = "\x03\x02\x01"
              [(ulong)(iVar28 < local_48[2]) +
               (ulong)(iVar28 < local_48[1]) + (ulong)(iVar28 <= local_48[0])];
      bVar2 = "\x03\x02\x01"
              [(ulong)(iVar18 < local_48[2]) +
               (ulong)(iVar18 < local_48[1]) + (ulong)(iVar18 <= local_48[0])];
      bVar3 = "\x03\x02\x01"
              [(ulong)(iVar24 < local_48[2]) +
               (ulong)(iVar24 < local_48[1]) + (ulong)(iVar24 <= local_48[0])];
      bVar4 = "\x03\x02\x01"
              [(ulong)(iVar6 < local_48[2]) +
               (ulong)(iVar6 < local_48[1]) + (ulong)(iVar6 <= local_48[0])];
      sels[uVar30] = bVar1;
      sels[uVar30 + 1] = bVar2;
      sels[uVar30 + 2] = bVar3;
      sels[uVar30 + 3] = bVar4;
      iVar6 = (uint)pSrc_pixels[uVar30].field_0.field_0.r - block_r[bVar1];
      iVar11 = (uint)pSrc_pixels[uVar30].field_0.field_0.g - block_g[bVar1];
      iVar19 = (uint)pSrc_pixels[uVar30].field_0.field_0.b - block_b[bVar1];
      iVar12 = (uint)pSrc_pixels[uVar30 + 1].field_0.field_0.r - block_r[bVar2];
      iVar18 = (uint)pSrc_pixels[uVar30 + 1].field_0.field_0.g - block_g[bVar2];
      iVar29 = (uint)pSrc_pixels[uVar30 + 1].field_0.field_0.b - block_b[bVar2];
      iVar13 = (uint)pSrc_pixels[uVar30 + 2].field_0.field_0.r - block_r[bVar3];
      iVar28 = (uint)pSrc_pixels[uVar30 + 2].field_0.field_0.g - block_g[bVar3];
      iVar14 = (uint)pSrc_pixels[uVar30 + 2].field_0.field_0.b - block_b[bVar3];
      iVar24 = (uint)pSrc_pixels[uVar30 + 3].field_0.field_0.r - block_r[bVar4];
      iVar9 = (uint)pSrc_pixels[uVar30 + 3].field_0.field_0.g - block_g[bVar4];
      iVar15 = (uint)pSrc_pixels[uVar30 + 3].field_0.field_0.b - block_b[bVar4];
      uVar5 = iVar6 * iVar6 + uVar5 + iVar19 * iVar19 + iVar11 * iVar11 +
              iVar29 * iVar29 + iVar18 * iVar18 + iVar12 * iVar12 +
              iVar24 * iVar24 + iVar14 * iVar14 + iVar28 * iVar28 + iVar13 * iVar13 +
              iVar15 * iVar15 + iVar9 * iVar9;
      uVar30 = uVar30 + 4;
    } while (uVar5 < cur_err);
  }
  else if ((flags >> 8 & 1) == 0) {
    bc1_get_block_colors4(block_r,block_g,block_b,lr,lg,lb,hr,hg,hb);
    iVar7 = block_r[3] - block_r[0];
    iVar8 = block_g[3] - block_g[0];
    iVar10 = block_b[3] - block_b[0];
    uVar5 = 0;
    for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
      bVar1 = pSrc_pixels[lVar16].field_0.field_0.r;
      bVar2 = pSrc_pixels[lVar16].field_0.field_0.g;
      bVar3 = pSrc_pixels[lVar16].field_0.field_0.b;
      uVar27 = (uint)((float)(int)((bVar3 - block_b[0]) * iVar10 +
                                  (bVar2 - block_g[0]) * iVar8 + (bVar1 - block_r[0]) * iVar7) *
                      (4.0 / ((float)(iVar10 * iVar10 + iVar8 * iVar8 + iVar7 * iVar7) + 1.25e-06))
                     + 0.5);
      if (2 < (int)uVar27) {
        uVar27 = 3;
      }
      uVar30 = (ulong)uVar27;
      if ((int)uVar27 < 2) {
        uVar30 = 1;
      }
      uVar17 = (int)uVar30 - 1;
      uVar21 = (ulong)uVar17;
      iVar6 = block_g[uVar21] - (uint)bVar2;
      iVar24 = block_b[uVar21] - (uint)bVar3;
      uVar27 = iVar24 * iVar24 +
               iVar6 * iVar6 + (block_r[uVar21] - (uint)bVar1) * (block_r[uVar21] - (uint)bVar1);
      iVar6 = block_r[uVar30] - (uint)bVar1;
      uVar22 = (block_b[uVar30] - (uint)bVar3) * (block_b[uVar30] - (uint)bVar3) +
               (block_g[uVar30] - (uint)bVar2) * (block_g[uVar30] - (uint)bVar2) + iVar6 * iVar6;
      if (uVar27 == uVar22) {
        if (uVar17 == 0) {
          uVar30 = uVar21;
        }
        uVar26 = (uint8_t)uVar30;
      }
      else {
        if (uVar27 < uVar22) {
          uVar30 = uVar21;
        }
        uVar26 = (uint8_t)uVar30;
        if (uVar27 >= uVar22) {
          uVar27 = uVar22;
        }
      }
      uVar5 = uVar5 + uVar27;
      if (cur_err <= uVar5) {
        return uVar5;
      }
      sels[lVar16] = uVar26;
    }
  }
  else {
    bc1_get_block_colors4(block_r,block_g,block_b,lr,lg,lb,hr,hg,hb);
    uVar5 = 0;
    for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
      uVar17 = (uint)pSrc_pixels[lVar16].field_0.field_0.r;
      iVar7 = block_r[0] - uVar17;
      uVar22 = (uint)pSrc_pixels[lVar16].field_0.field_0.g;
      iVar10 = block_g[0] - uVar22;
      uVar20 = (uint)pSrc_pixels[lVar16].field_0.field_0.b;
      iVar8 = block_b[0] - uVar20;
      uVar27 = iVar8 * iVar8 + iVar10 * iVar10 + iVar7 * iVar7;
      uVar25 = 0;
      uVar30 = 1;
      while ((uVar30 < 4 && (uVar27 != 0))) {
        iVar7 = block_r[uVar30] - uVar17;
        iVar10 = block_g[uVar30] - uVar22;
        iVar8 = block_b[uVar30] - uVar20;
        uVar23 = iVar8 * iVar8 + iVar10 * iVar10 + iVar7 * iVar7;
        if ((uVar23 < uVar27) || ((uVar30 == 3 && (uVar23 == uVar27)))) {
          uVar25 = (undefined4)uVar30;
          uVar27 = uVar23;
        }
        uVar30 = uVar30 + 1;
      }
      uVar5 = uVar5 + uVar27;
      if (cur_err <= uVar5) {
        return uVar5;
      }
      sels[lVar16] = (uint8_t)uVar25;
    }
  }
  return uVar5;
}

Assistant:

static inline uint32_t bc1_find_sels4(uint32_t flags, const color32* pSrc_pixels, uint32_t lr, uint32_t lg, uint32_t lb, uint32_t hr, uint32_t hg, uint32_t hb, uint8_t sels[16], uint32_t cur_err)
	{
		uint32_t err;

		if (flags & cEncodeBC1UseFasterMSEEval)
			err = bc1_find_sels4_fasterr(pSrc_pixels, lr, lg, lb, hr, hg, hb, sels, cur_err);
		else if (flags & cEncodeBC1UseFullMSEEval)
			err = bc1_find_sels4_fullerr(pSrc_pixels, lr, lg, lb, hr, hg, hb, sels, cur_err);
		else
			err = bc1_find_sels4_check2_err(pSrc_pixels, lr, lg, lb, hr, hg, hb, sels, cur_err);

		return err;
	}